

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::
strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [7],String *params_1,
          char *params_2,StringPtr *params_3,String *params_4,char (*params_5) [22],
          CappedArray<char,_17UL> *params_6,char (*params_7) [10],uint *params_8,
          char (*params_9) [4])

{
  char *pcVar1;
  undefined8 uVar2;
  ArrayPtr<const_char> *params_9_00;
  undefined1 local_d1 [9];
  undefined8 local_c8;
  long local_c0;
  ArrayPtr<const_char> local_b8;
  undefined1 local_a8 [40];
  size_t local_80;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_d1._1_8_ = __return_storage_ptr__;
  local_a8._8_8_ = strlen((char *)this);
  pcVar1 = *(char **)(params[1] + 1);
  local_b8.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_b8.ptr = *(char **)params;
  }
  local_b8.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_b8.size_ = (size_t)(char *)0x0;
  }
  local_d1[0] = *(undefined1 *)&(params_1->content).ptr;
  local_c8 = *(undefined8 *)params_2;
  local_c0 = *(long *)(params_2 + 8) + -1;
  pcVar1 = (char *)(params_3->content).size_;
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = (params_3->content).ptr;
  }
  local_58.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_58.size_ = (size_t)(char *)0x0;
  }
  local_a8._0_8_ = this;
  local_68.size_ = strlen((char *)params_4);
  local_68.ptr = (char *)params_4;
  local_78.size_ = *(size_t *)*params_5;
  local_78.ptr = *params_5 + 8;
  local_80 = strlen((char *)params_6);
  local_a8._32_8_ = params_6;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)*params_7);
  params_9_00 = (ArrayPtr<const_char> *)0x179162;
  local_a8._24_8_ = strlen((char *)params_8);
  uVar2 = local_d1._1_8_;
  local_a8._16_8_ = params_8;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            ((StringTree *)local_d1._1_8_,(StringTree *)local_a8,&local_b8,
             (ArrayPtr<const_char> *)local_d1,(FixedArray<char,_1UL> *)&local_c8,&local_58,&local_68
             ,&local_78,(ArrayPtr<const_char> *)(local_a8 + 0x20),(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)(local_a8 + 0x10),params_9_00);
  return (StringTree *)uVar2;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}